

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O3

void __thiscall
t_st_generator::st_getter(t_st_generator *this,ostream *out,string *cls,string *name)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_68;
  string local_48;
  
  pcVar1 = (cls->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + cls->_M_string_length);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + name->_M_string_length);
  std::__cxx11::string::append((char *)&local_68);
  st_method(this,out,&local_48,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"^ ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,(name->_M_dataplus)._M_p,name->_M_string_length);
  st_close_method(this,out);
  return;
}

Assistant:

void t_st_generator::st_getter(std::ostream& out, string cls, string name) {
  st_method(out, cls, name + "");
  out << "^ " << name;
  st_close_method(out);
}